

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS
ref_smooth_local_cell_about
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT about_node,REF_BOOL *allowed)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  *allowed = 0;
  RVar4 = -1;
  uVar7 = 0xffffffff;
  if (-1 < about_node) {
    pRVar2 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    RVar4 = -1;
    if (about_node < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)about_node];
      uVar7 = 0xffffffff;
      RVar4 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar4 = pRVar2->item[(int)uVar1].ref;
        uVar7 = (ulong)uVar1;
      }
    }
  }
  do {
    if ((int)uVar7 == -1) {
      *allowed = 1;
      return -1;
    }
    iVar8 = 0;
    iVar5 = ref_cell->node_per;
    if (ref_cell->node_per < 1) {
      iVar5 = iVar8;
    }
    while (iVar5 != iVar8) {
      iVar6 = ref_cell->size_per * RVar4 + iVar8;
      iVar8 = iVar8 + 1;
      if (ref_node->ref_mpi->id != ref_node->part[ref_cell->c2n[iVar6]]) {
        return -1;
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar3[(int)uVar7].next;
    RVar4 = -1;
    if (uVar7 != 0xffffffffffffffff) {
      RVar4 = pRVar3[uVar7].ref;
    }
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_local_cell_about(REF_CELL ref_cell,
                                                      REF_NODE ref_node,
                                                      REF_INT about_node,
                                                      REF_BOOL *allowed) {
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  each_ref_cell_having_node(ref_cell, about_node, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  *allowed = REF_TRUE;

  return REF_SUCCESS;
}